

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5yy_pop_parser_stack(fts5yyParser *pParser)

{
  fts5YYMINORTYPE *fts5yypminor;
  long *in_RDI;
  fts5yyParser *unaff_retaddr;
  fts5yyStackEntry *fts5yytos;
  
  fts5yypminor = (fts5YYMINORTYPE *)*in_RDI;
  *in_RDI = (long)fts5yypminor + -0x18;
  fts5yy_destructor(unaff_retaddr,(uchar)((ulong)in_RDI >> 0x38),fts5yypminor);
  return;
}

Assistant:

static void fts5yy_pop_parser_stack(fts5yyParser *pParser){
  fts5yyStackEntry *fts5yytos;
  assert( pParser->fts5yytos!=0 );
  assert( pParser->fts5yytos > pParser->fts5yystack );
  fts5yytos = pParser->fts5yytos--;
#ifndef NDEBUG
  if( fts5yyTraceFILE ){
    fprintf(fts5yyTraceFILE,"%sPopping %s\n",
      fts5yyTracePrompt,
      fts5yyTokenName[fts5yytos->major]);
  }
#endif
  fts5yy_destructor(pParser, fts5yytos->major, &fts5yytos->minor);
}